

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O1

void Mvc_CoverArray2List(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t **ppMVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t **ppMVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  if (pCover->pCubes != (Mvc_Cube_t **)0x0) {
    iVar5 = Mvc_CoverReadCubeNum(pCover);
    if (iVar5 != 0) {
      if (iVar5 == 1) {
        pMVar2 = *pCover->pCubes;
        pMVar2->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar2;
        (pCover->lCubes).pHead = pMVar2;
      }
      else {
        ppMVar3 = pCover->pCubes;
        (pCover->lCubes).pHead = *ppMVar3;
        pMVar2 = ppMVar3[(long)iVar5 + -1];
        pMVar2->pNext = (Mvc_Cube_t *)0x0;
        (pCover->lCubes).pTail = pMVar2;
        if (1 < iVar5) {
          uVar6 = 0;
          do {
            ppMVar1 = ppMVar3 + uVar6;
            lVar4 = uVar6 + 1;
            uVar6 = uVar6 + 1;
            (*ppMVar1)->pNext = ppMVar3[lVar4];
          } while (iVar5 - 1 != uVar6);
        }
      }
    }
    return;
  }
  __assert_fail("pCover->pCubes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                ,0x13b,"void Mvc_CoverArray2List(Mvc_Cover_t *)");
}

Assistant:

void Mvc_CoverArray2List( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nCubes, i;

    assert( pCover->pCubes );

    nCubes = Mvc_CoverReadCubeNum(pCover);
    if ( nCubes == 0 )
        return;
    if ( nCubes == 1 )
    {
        pCube    = pCover->pCubes[0];
        pCube->pNext = NULL;
        pCover->lCubes.pHead = pCover->lCubes.pTail = pCube;
        return;
    }
    // set up the first cube
    pCube = pCover->pCubes[0];
    pCover->lCubes.pHead = pCube;
    // set up the last cube
    pCube = pCover->pCubes[nCubes-1];
    pCube->pNext = NULL;
    pCover->lCubes.pTail = pCube;

    // link all cubes starting from the first one
    for ( i = 0; i < nCubes - 1; i++ )
        pCover->pCubes[i]->pNext = pCover->pCubes[i+1];
}